

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall llm_tokenizer_bpe::llm_tokenizer_bpe(llm_tokenizer_bpe *this,llama_vocab *vocab)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var2;
  long lVar3;
  long *plVar4;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_llm_tokenizer)._vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_bpe_002862e0;
  pvVar1 = &this->regex_exprs;
  (this->regex_exprs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->regex_exprs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->regex_exprs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var2._M_head_impl =
       (vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  if ((_Var2._M_head_impl)->type == LLAMA_VOCAB_TYPE_BPE) {
    switch((_Var2._M_head_impl)->pre_type) {
    case LLAMA_VOCAB_PRE_TYPE_LLAMA3:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_LLM:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"[\r\n]","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,anon_var_dwarf_3afe46,anon_var_dwarf_3afe46 + 499);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,anon_var_dwarf_3afe60,anon_var_dwarf_3afe60 + 0x28);
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"\\s+$","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,anon_var_dwarf_3afe78,anon_var_dwarf_3afe78 + 0x18);
      plVar4 = local_30;
      local_40[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\\p{N}+","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,&stack0xffffffffffffffe0);
      lVar3 = -0xc0;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_CODER:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"[\r\n]","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"\\s?\\p{L}+","");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"\\s?\\p{P}+","");
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,anon_var_dwarf_3afe78,anon_var_dwarf_3afe78 + 0x18);
      plVar4 = local_50;
      local_60[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"\\p{N}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_40);
      lVar3 = -0xa0;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_FALCON:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"[\\p{P}\\$\\+<=>\\^~\\|`]+","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,
                 "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                 ,"");
      plVar4 = local_90;
      local_a0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"[0-9][0-9][0-9]","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_80);
      lVar3 = -0x60;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_MPT:
    case LLAMA_VOCAB_PRE_TYPE_GPT2:
    case LLAMA_VOCAB_PRE_TYPE_OLMO:
    case LLAMA_VOCAB_PRE_TYPE_JAIS:
    case LLAMA_VOCAB_PRE_TYPE_TRILLION:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_STARCODER:
    case LLAMA_VOCAB_PRE_TYPE_REFACT:
    case LLAMA_VOCAB_PRE_TYPE_COMMAND_R:
    case LLAMA_VOCAB_PRE_TYPE_SMOLLM:
    case LLAMA_VOCAB_PRE_TYPE_CODESHELL:
    case LLAMA_VOCAB_PRE_TYPE_EXAONE:
    case LLAMA_VOCAB_PRE_TYPE_MINERVA:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"\\p{N}","");
      plVar4 = local_b0;
      local_c0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,
                 "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_a0);
      lVar3 = -0x40;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_STABLELM2:
    case LLAMA_VOCAB_PRE_TYPE_QWEN2:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_DBRX:
    case LLAMA_VOCAB_PRE_TYPE_SMAUG:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_PORO:
    case LLAMA_VOCAB_PRE_TYPE_BLOOM:
    case LLAMA_VOCAB_PRE_TYPE_GPT3_FINNISH:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,anon_var_dwarf_3aff38,anon_var_dwarf_3aff38 + 0x22);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    default:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"[\\p{P}\\$\\+<=>\\^~\\|]+","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,
                 "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                 ,"");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"\\p{N}+","");
      plVar4 = local_70;
      local_80[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"[0-9][0-9][0-9]","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_60);
      lVar3 = -0x80;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_CHATGLM4:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_VIKING:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,anon_var_dwarf_3aff38,anon_var_dwarf_3aff38 + 0x22);
      plVar4 = local_b0;
      local_c0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"\\p{N}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_a0);
      lVar3 = -0x40;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_TEKKEN:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_CHAMELEON:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"<sentinel:[0-9]+>","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"(IMGIMG)((A|B|C|D|E|F|G|H|I){1,4})Z","");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"([\\t\\n]|    |  )","");
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"\\p{N}","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"[\\p{P}!-/:-@\\[-`{-~]","");
      plVar4 = local_30;
      local_40[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,
                 "\'s|\'t|\'re|\'ve|\'m|\'ll|\'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,&stack0xffffffffffffffe0);
      lVar3 = -0xc0;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK3_LLM:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"\\p{N}{1,3}","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,anon_var_dwarf_3afea8,anon_var_dwarf_3afea8 + 0x18);
      plVar4 = local_90;
      local_a0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "[!\"#$%&\'()*+,\\-./:;<=>?@\\[\\\\\\]^_`{|}~][A-Za-z]+|[^\r\n\\p{L}\\p{P}\\p{S}]?[\\p{L}\\p{M}]+| ?[\\p{P}\\p{S}]+[\r\n]*|\\s*[\r\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_80);
      lVar3 = -0x60;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_GPT4O:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])?|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*(?:\'[sS]|\'[tT]|\'[rR][eE]|\'[vV][eE]|\'[mM]|\'[lL][lL]|\'[dD])?|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
      break;
    case LLAMA_VOCAB_PRE_TYPE_SUPERBPE:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"\\p{N}+","");
      plVar4 = local_b0;
      local_c0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"(?=(\\d{3})+(?!\\d))","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_a0);
      lVar3 = -0x40;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar3 = lVar3 + 0x20;
      } while (lVar3 != 0);
      return;
    case LLAMA_VOCAB_PRE_TYPE_BAILINGMOE:
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,
                 "\'(?:[sSdDmMtT]|[lL][lL]|[vV][eE]|[rR][eE])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]|\\s+(?!\\S)|\\s+"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 local_e0,local_c0);
    }
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
             ,0x116,"GGML_ASSERT(%s) failed","vocab.get_type() == LLAMA_VOCAB_TYPE_BPE");
}

Assistant:

llm_tokenizer_bpe(const llama_vocab & vocab) {
        GGML_ASSERT(vocab.get_type() == LLAMA_VOCAB_TYPE_BPE);
        switch (vocab.get_pre_type()) {
            case LLAMA_VOCAB_PRE_TYPE_LLAMA3:
                regex_exprs = {
                    // original regex from tokenizer.json
                    //"(?i:'s|'t|'re|'ve|'m|'ll|'d)|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",

                    // adapted: https://github.com/ggerganov/llama.cpp/pull/6920#issuecomment-2080233989
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DBRX:
            case LLAMA_VOCAB_PRE_TYPE_SMAUG:
                regex_exprs = {
                    // same as llama3
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_LLM:
                regex_exprs = {
                    "[\r\n]",
                    "\\s?[A-Za-zµÀ-ÖØ-öø-ƺƼ-ƿǄ-ʓʕ-ʯͰ-ͳͶͷͻ-ͽͿΆΈ-ΊΌΎ-ΡΣ-ϵϷ-ҁҊ-ԯԱ-ՖႠ-ჅᎠ-Ᏽᏸ-ᏽᲐ-ᲺᲽ-Ჿᴀ-ᴫᵫ-ᵷᵹ-ᶚḀ-ἕἘ-Ἕἠ-ὅὈ-Ὅὐ-ὗὙὛὝὟ-ώᾀ-ᾴᾶ-ᾼιῂ-ῄῆ-ῌῐ-ΐῖ-Ίῠ-Ῥῲ-ῴῶ-ῼℂℇℊ-ℓℕℙ-ℝℤΩℨK-ℭℯ-ℴℹℼ-ℿⅅ-ⅉⅎↃↄⰀ-ⱻⱾ-ⳤⳫ-ⳮⳲⳳꙀ-ꙭꚀ-ꚛꜢ-ꝯꝱ-ꞇꞋ-ꞎꭰ-ꮿﬀ-ﬆﬓ-ﬗＡ-Ｚａ-ｚ𐐀-𐑏𐒰-𐓓𐓘-𐓻𐲀-𐲲𐳀-𐳲𑢠-𑣟𞤀-𞥃]+",
                    "\\s?[!-/:-~！-／：-～‘-‟　-。]+",
                    "\\s+$",
                    "[一-龥ࠀ-一가-퟿]+",
                    "\\p{N}+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK3_LLM:
                regex_exprs = {
                    "\\p{N}{1,3}",
                    "[一-龥぀-ゟ゠-ヿ]+",
                    "[!\"#$%&'()*+,\\-./:;<=>?@\\[\\\\\\]^_`{|}~][A-Za-z]+|[^\r\n\\p{L}\\p{P}\\p{S}]?[\\p{L}\\p{M}]+| ?[\\p{P}\\p{S}]+[\r\n]*|\\s*[\r\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_DEEPSEEK_CODER:
                regex_exprs = {
                    "[\r\n]",
                    "\\s?\\p{L}+",
                    "\\s?\\p{P}+",
                    "[一-龥ࠀ-一가-퟿]+",
                    "\\p{N}",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_FALCON:
                regex_exprs = {
                    "[\\p{P}\\$\\+<=>\\^~\\|`]+",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                    "[0-9][0-9][0-9]",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_STARCODER:
            case LLAMA_VOCAB_PRE_TYPE_REFACT:
            case LLAMA_VOCAB_PRE_TYPE_COMMAND_R:
            case LLAMA_VOCAB_PRE_TYPE_SMOLLM:
            case LLAMA_VOCAB_PRE_TYPE_CODESHELL:
            case LLAMA_VOCAB_PRE_TYPE_EXAONE:
            case LLAMA_VOCAB_PRE_TYPE_MINERVA:
                regex_exprs = {
                    "\\p{N}",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_GPT2:
            case LLAMA_VOCAB_PRE_TYPE_MPT:
            case LLAMA_VOCAB_PRE_TYPE_OLMO:
            case LLAMA_VOCAB_PRE_TYPE_JAIS:
            case LLAMA_VOCAB_PRE_TYPE_TRILLION:
                regex_exprs = {
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_STABLELM2:
            case LLAMA_VOCAB_PRE_TYPE_QWEN2:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "(?i:'s|'t|'re|'ve|'m|'ll|'d)|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_PORO:
            case LLAMA_VOCAB_PRE_TYPE_BLOOM:
            case LLAMA_VOCAB_PRE_TYPE_GPT3_FINNISH:
                regex_exprs = {
                    " ?[^(\\s|.,!?…。，、।۔،)]+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_CHATGLM4:
                regex_exprs = {
                    "(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_VIKING:
                regex_exprs = {
                    " ?[^(\\s|.,!?…。，、।۔،)]+",
                    "\\p{N}",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_TEKKEN:
                // original regex from tokenizer.json
                // "[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]*[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]+|[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]+[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]*|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+"
                regex_exprs = {
                    "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_CHAMELEON:
                // Note: in theory, the special token (sentinel and image token) regex_exprs below
                // are unnecessary, as they are split in `tokenizer_st_partition` anyway.
                // However, since the upstream pre-tokenizer uses them, they are also
                // included here (see https://huggingface.co/facebook/chameleon-7b).
                regex_exprs = {
                    "<sentinel:[0-9]+>",  // Sentinel tokens
                    "(IMGIMG)((A|B|C|D|E|F|G|H|I){1,4})Z",  // Image tokens
                    "([\\t\\n]|    |  )",  // directly from tokenizer.json
                    "\\p{N}", // Individual digits
                    "[\\p{P}!-/:-@\\[-`{-~]",  // Punctuation, Isolated
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_GPT4O:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]*[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]+(?i:'s|'t|'re|'ve|'m|'ll|'d)?|[^\\r\\n\\p{L}\\p{N}]?[\\p{Lu}\\p{Lt}\\p{Lm}\\p{Lo}\\p{M}]+[\\p{Ll}\\p{Lm}\\p{Lo}\\p{M}]*(?i:'s|'t|'re|'ve|'m|'ll|'d)?|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                    "[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))*((?=[\\p{L}])([^A-Z]))+(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])?|[^\\r\\n\\p{L}\\p{N}]?((?=[\\p{L}])([^a-z]))+((?=[\\p{L}])([^A-Z]))*(?:'[sS]|'[tT]|'[rR][eE]|'[vV][eE]|'[mM]|'[lL][lL]|'[dD])?|\\p{N}{1,3}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n/]*|\\s*[\\r\\n]+|\\s+(?!\\S)|\\s+",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_SUPERBPE:
                regex_exprs = {
                    "\\p{N}+",
                    "(?=(\\d{3})+(?!\\d))",
                };
                break;
            case LLAMA_VOCAB_PRE_TYPE_BAILINGMOE:
                regex_exprs = {
                    // original regex from tokenizer.json
                    // "'(?i:[sdmt]|ll|ve|re)|[^\\r\\n\\p{L}\\p{N}]?+\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]++[\\r\\n]*|\\s*[\\r\\n]|\\s+(?!\\S)|\\s+"
                    // FIXME? Changed possessive quantifiers (?+ and ++) to greedy to avoid errors and imatrix hanging (tried atomic grouping but it's not supported?)
                    "'(?:[sSdDmMtT]|[lL][lL]|[vV][eE]|[rR][eE])|[^\\r\\n\\p{L}\\p{N}]?\\p{L}+|\\p{N}| ?[^\\s\\p{L}\\p{N}]+[\\r\\n]*|\\s*[\\r\\n]|\\s+(?!\\S)|\\s+",
                };
                break;
            default:
                // default regex for BPE tokenization pre-processing
                regex_exprs = {
                    "[\\p{P}\\$\\+<=>\\^~\\|]+",
                    "'s|'t|'re|'ve|'m|'ll|'d| ?\\p{L}+| ?\\p{N}+| ?[^\\s\\p{L}\\p{N}]+|\\s+(?!\\S)",
                    "\\p{N}+",
                    "[0-9][0-9][0-9]",
                };
                break;
        }
    }